

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.h
# Opt level: O3

void __thiscall FSkillInfo::FSkillInfo(FSkillInfo *this,FSkillInfo *other)

{
  (this->Name).Index = 0;
  (this->MenuName).Chars = FString::NullString.Nothing;
  (this->PicName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  (this->MenuNamesForPlayerClass).NumUsed = 0;
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::SetNodeVector
            (&this->MenuNamesForPlayerClass,1);
  (this->MustConfirmText).Chars = FString::NullString.Nothing;
  (this->TextColor).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  (this->Replace).NumUsed = 0;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::SetNodeVector(&this->Replace,1);
  (this->Replaced).NumUsed = 0;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::SetNodeVector(&this->Replaced,1);
  operator=(this,other);
  return;
}

Assistant:

FSkillInfo(const FSkillInfo &other)
	{
		operator=(other);
	}